

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::AttributeArray::data
          (AttributeArray *this,Target target,size_t size,char *ptr,Usage usage)

{
  Context *pCVar1;
  GLenum GVar2;
  deUint32 dVar3;
  GLenum GVar4;
  char *pcVar5;
  Usage usage_local;
  char *ptr_local;
  size_t size_local;
  Target target_local;
  AttributeArray *this_local;
  
  this->m_size = (int)size;
  this->m_target = target;
  if (this->m_storage == STORAGE_BUFFER) {
    pCVar1 = this->m_ctx;
    GVar2 = targetToGL(target);
    (*pCVar1->_vptr_Context[0x25])(pCVar1,(ulong)GVar2,(ulong)this->m_glBuffer);
    dVar3 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar3,"glBindBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x3d3);
    pCVar1 = this->m_ctx;
    GVar2 = targetToGL(target);
    GVar4 = usageToGL(usage);
    (*pCVar1->_vptr_Context[0x28])(pCVar1,(ulong)GVar2,size,ptr,(ulong)GVar4);
    dVar3 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar3,"glBufferData()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x3d6);
  }
  else if (this->m_storage == STORAGE_USER) {
    if ((this->m_data != (char *)0x0) && (this->m_data != (char *)0x0)) {
      operator_delete__(this->m_data);
    }
    pcVar5 = (char *)operator_new__(size);
    this->m_data = pcVar5;
    memcpy(this->m_data,ptr,size);
  }
  return;
}

Assistant:

void AttributeArray::data (DrawTestSpec::Target target, size_t size, const char* ptr, DrawTestSpec::Usage usage)
{
	m_size = (int)size;
	m_target = target;

	if (m_storage == DrawTestSpec::STORAGE_BUFFER)
	{
		m_ctx.bindBuffer(targetToGL(target), m_glBuffer);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBindBuffer()");

		m_ctx.bufferData(targetToGL(target), size, ptr, usageToGL(usage));
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBufferData()");
	}
	else if (m_storage == DrawTestSpec::STORAGE_USER)
	{
		if (m_data)
			delete[] m_data;

		m_data = new char[size];
		std::memcpy(m_data, ptr, size);
	}
	else
		DE_ASSERT(false);
}